

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O0

bool __thiscall QPDFMatrix::operator==(QPDFMatrix *this,QPDFMatrix *rhs)

{
  bool local_19;
  QPDFMatrix *rhs_local;
  QPDFMatrix *this_local;
  
  local_19 = false;
  if ((this->a == rhs->a) && (!NAN(this->a) && !NAN(rhs->a))) {
    local_19 = false;
    if ((this->b == rhs->b) && (!NAN(this->b) && !NAN(rhs->b))) {
      local_19 = false;
      if ((this->c == rhs->c) && (!NAN(this->c) && !NAN(rhs->c))) {
        local_19 = false;
        if ((this->d == rhs->d) && (!NAN(this->d) && !NAN(rhs->d))) {
          local_19 = false;
          if ((this->e == rhs->e) && (!NAN(this->e) && !NAN(rhs->e))) {
            local_19 = this->f == rhs->f;
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool
QPDFMatrix::operator==(QPDFMatrix const& rhs) const
{
    return (
        (this->a == rhs.a) && (this->b == rhs.b) && (this->c == rhs.c) && (this->d == rhs.d) &&
        (this->e == rhs.e) && (this->f == rhs.f));
}